

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall
cmListFileBacktrace::cmListFileBacktrace(cmListFileBacktrace *this,cmStateSnapshot *snapshot)

{
  cmStateSnapshot cStack_28;
  
  cmStateSnapshot::GetCallStackBottom(&cStack_28,snapshot);
  std::make_shared<cmListFileBacktrace::Entry_const,cmStateSnapshot>((cmStateSnapshot *)this);
  return;
}

Assistant:

cmListFileBacktrace::cmListFileBacktrace(cmStateSnapshot const& snapshot)
  : TopEntry(std::make_shared<Entry const>(snapshot.GetCallStackBottom()))
{
}